

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encode.c
# Opt level: O0

void emitblock(aec_stream *strm,int k,int ref)

{
  uint uVar1;
  internal_state *piVar2;
  uint32_t *puVar3;
  uint8_t uVar4;
  uint8_t uVar5;
  uint8_t uVar6;
  uint8_t uVar7;
  uint8_t uVar8;
  uint8_t uVar9;
  int p;
  uint8_t *o;
  uint64_t mask;
  uint32_t *in_end;
  uint32_t *in;
  internal_state *state;
  uint64_t a;
  int ref_local;
  int k_local;
  aec_stream *strm_local;
  
  piVar2 = strm->state;
  in = piVar2->block + ref;
  puVar3 = piVar2->block;
  uVar1 = strm->block_size;
  p = piVar2->bits;
  a = (uint64_t)*piVar2->cds;
  o = piVar2->cds;
  while (in < puVar3 + uVar1) {
    a = a << 0x38;
    p = p % 8 + 0x38;
    for (; k < p && in < puVar3 + uVar1; in = in + 1) {
      p = p - k;
      a = (((ulong)*in & (1L << ((byte)k & 0x3f)) - 1U) << ((byte)p & 0x3f)) + a;
    }
    uVar9 = (uint8_t)(a >> 0x10);
    uVar8 = (uint8_t)(a >> 0x18);
    uVar7 = (uint8_t)(a >> 0x20);
    uVar6 = (uint8_t)(a >> 0x28);
    uVar5 = (uint8_t)(a >> 0x30);
    uVar4 = (uint8_t)(a >> 0x38);
    switch(p & 0xfffffff8) {
    case 0:
      *o = uVar4;
      o[1] = uVar5;
      o[2] = uVar6;
      o[3] = uVar7;
      o[4] = uVar8;
      o[5] = uVar9;
      o[6] = (uint8_t)(a >> 8);
      o = o + 7;
      break;
    case 8:
      *o = uVar4;
      o[1] = uVar5;
      o[2] = uVar6;
      o[3] = uVar7;
      o[4] = uVar8;
      o[5] = uVar9;
      a = a >> 8;
      o = o + 6;
      break;
    case 0x10:
      *o = uVar4;
      o[1] = uVar5;
      o[2] = uVar6;
      o[3] = uVar7;
      o[4] = uVar8;
      a = a >> 0x10;
      o = o + 5;
      break;
    case 0x18:
      *o = uVar4;
      o[1] = uVar5;
      o[2] = uVar6;
      o[3] = uVar7;
      a = a >> 0x18;
      o = o + 4;
      break;
    case 0x20:
      *o = uVar4;
      o[1] = uVar5;
      o[2] = uVar6;
      a = a >> 0x20;
      o = o + 3;
      break;
    case 0x28:
      *o = uVar4;
      o[1] = uVar5;
      a = a >> 0x28;
      o = o + 2;
      break;
    case 0x30:
      *o = uVar4;
      a = a >> 0x30;
      o = o + 1;
      break;
    default:
      a = a >> 0x38;
    }
  }
  *o = (uint8_t)a;
  piVar2->cds = o;
  piVar2->bits = p % 8;
  return;
}

Assistant:

static inline void emitblock(struct aec_stream *strm, int k, int ref)
{
    /**
       Emit the k LSB of a whole block of input data.
    */

    uint64_t a;
    struct internal_state *state = strm->state;
    uint32_t *in = state->block + ref;
    uint32_t *in_end = state->block + strm->block_size;
    uint64_t mask = (UINT64_C(1) << k) - 1;
    uint8_t *o = state->cds;
    int p = state->bits;

    a = *o;

    while(in < in_end) {
        a <<= 56;
        p = (p % 8) + 56;

        while (p > k && in < in_end) {
            p -= k;
            a += ((uint64_t)(*in++) & mask) << p;
        }

        switch (p & ~7) {
        case 0:
            o[0] = (uint8_t)(a >> 56);
            o[1] = (uint8_t)(a >> 48);
            o[2] = (uint8_t)(a >> 40);
            o[3] = (uint8_t)(a >> 32);
            o[4] = (uint8_t)(a >> 24);
            o[5] = (uint8_t)(a >> 16);
            o[6] = (uint8_t)(a >> 8);
            o += 7;
            break;
        case 8:
            o[0] = (uint8_t)(a >> 56);
            o[1] = (uint8_t)(a >> 48);
            o[2] = (uint8_t)(a >> 40);
            o[3] = (uint8_t)(a >> 32);
            o[4] = (uint8_t)(a >> 24);
            o[5] = (uint8_t)(a >> 16);
            a >>= 8;
            o += 6;
            break;
        case 16:
            o[0] = (uint8_t)(a >> 56);
            o[1] = (uint8_t)(a >> 48);
            o[2] = (uint8_t)(a >> 40);
            o[3] = (uint8_t)(a >> 32);
            o[4] = (uint8_t)(a >> 24);
            a >>= 16;
            o += 5;
            break;
        case 24:
            o[0] = (uint8_t)(a >> 56);
            o[1] = (uint8_t)(a >> 48);
            o[2] = (uint8_t)(a >> 40);
            o[3] = (uint8_t)(a >> 32);
            a >>= 24;
            o += 4;
            break;
        case 32:
            o[0] = (uint8_t)(a >> 56);
            o[1] = (uint8_t)(a >> 48);
            o[2] = (uint8_t)(a >> 40);
            a >>= 32;
            o += 3;
            break;
        case 40:
            o[0] = (uint8_t)(a >> 56);
            o[1] = (uint8_t)(a >> 48);
            a >>= 40;
            o += 2;
            break;
        case 48:
            *o++ = (uint8_t)(a >> 56);
            a >>= 48;
            break;
        default:
            a >>= 56;
            break;
        }
    }

    *o = (uint8_t)a;
    state->cds = o;
    state->bits = p % 8;
}